

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

int lookupid(char *data,size_t length,name_entry_t *table,size_t count)

{
  int i;
  size_t sVar1;
  void *pvVar2;
  char name [20];
  
  i = 0;
  if (length < 0x14) {
    for (sVar1 = 0; length != sVar1; sVar1 = sVar1 + 1) {
      name[sVar1] = data[sVar1];
    }
    name[length] = '\0';
    pvVar2 = bsearch(name,table,count >> 4,0x10,name_entry_compare);
    if (pvVar2 == (void *)0x0) {
      i = 0;
    }
    else {
      i = *(int *)((long)pvVar2 + 8);
    }
  }
  return i;
}

Assistant:

static int lookupid(const char* data, size_t length, const name_entry_t* table, size_t count)
{
    if(length > MAX_NAME)
        return 0;
    char name[MAX_NAME + 1];
    for(int i = 0; i < length; i++)
        name[i] = data[i];
    name[length] = '\0';

    name_entry_t* entry = bsearch(name, table, count / sizeof(name_entry_t), sizeof(name_entry_t), name_entry_compare);
    if(entry == NULL)
        return 0;
    return entry->id;
}